

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O2

void P_Spawn3DFloors(void)

{
  uint uVar1;
  int alpha;
  int param2;
  line_t *line;
  long lVar2;
  int line_00;
  long lVar3;
  
  line_00 = 0;
  line = lines;
  do {
    if (numlines <= line_00) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < numsectors; lVar3 = lVar3 + 1) {
        P_Recalculate3DFloors((sector_t *)((long)&sectors->planes[0].xform.xOffs + lVar2));
        lVar2 = lVar2 + 0x268;
      }
      return;
    }
    if (line->special == 0xa0) {
      if (level.maptype == MAPTYPE_HEXEN) {
        if ((line->args[1] & 8) == 0) {
          line->args[0] = line->args[0] + line->args[4] * 0x100;
          line->args[4] = 0;
        }
        else {
          FTagManager::AddLineID(&tagManager,line_00,line->args[4]);
        }
      }
      param2 = line->args[2];
      uVar1 = line->args[1] & 0xfffffff7;
      alpha = line->args[3];
LAB_00476351:
      P_Set3DFloor(line,uVar1,param2,alpha);
      line->special = 0;
      line->args[0] = 0;
      line->args[1] = 0;
      line->args[2] = 0;
      line->args[3] = 0;
      line->args[4] = 0;
    }
    else if (line->special == 0x32) {
      uVar1 = line->args[1];
      if (2 < uVar1) {
        line->args[1] = 0;
        uVar1 = 0;
      }
      param2 = P_Spawn3DFloors::flagvals[uVar1];
      uVar1 = 3;
      alpha = 0;
      goto LAB_00476351;
    }
    line_00 = line_00 + 1;
    line = line + 1;
  } while( true );
}

Assistant:

void P_Spawn3DFloors (void)
{
	static int flagvals[] = {512, 2+512, 512+1024};
	int i;
	line_t * line;

	for (i=0,line=lines;i<numlines;i++,line++)
	{
		switch(line->special)
		{
		case ExtraFloor_LightOnly:
			if (line->args[1] < 0 || line->args[1] > 2) line->args[1] = 0;
			P_Set3DFloor(line, 3, flagvals[line->args[1]], 0);
			break;

		case Sector_Set3DFloor:
			// The flag high-byte/line id is only needed in Hexen format.
			// UDMF can set both of these parameters without any restriction of the usable values.
			// In Doom format the translators can take full integers for the tag and the line ID always is the same as the tag.
			if (level.maptype == MAPTYPE_HEXEN)	
			{
				if (line->args[1]&8)
				{
					tagManager.AddLineID(i, line->args[4]);
				}
				else
				{
					line->args[0]+=256*line->args[4];
					line->args[4]=0;
				}
			}
			P_Set3DFloor(line, line->args[1]&~8, line->args[2], line->args[3]);
			break;

		default:
			continue;
		}
		line->special=0;
		line->args[0] = line->args[1] = line->args[2] = line->args[3] = line->args[4] = 0;
	}
	// kg3D - do it in software
	for (i = 0; i < numsectors; i++)
	{
		P_Recalculate3DFloors(&sectors[i]);
	}
}